

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_21daf9::DescriptorImpl::IsRange(DescriptorImpl *this)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  bool bVar5;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *pubkey;
  pointer puVar6;
  pointer puVar7;
  long in_FS_OFFSET;
  bool bVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar2) {
      puVar7 = (this->m_subdescriptor_args).
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->m_subdescriptor_args).
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0015b13c;
    }
    iVar4 = (*((puVar6->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl)
              ->_vptr_PubkeyProvider[3])();
    puVar6 = puVar6 + 1;
  } while ((char)iVar4 == '\0');
  bVar5 = true;
  goto LAB_0015b154;
  while( true ) {
    bVar8 = IsRange((puVar7->_M_t).
                    super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>.
                    _M_head_impl);
    puVar7 = puVar7 + 1;
    if (bVar8) break;
LAB_0015b13c:
    bVar8 = puVar7 == puVar3;
    bVar5 = !bVar8;
    if (bVar8) break;
  }
LAB_0015b154:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool IsRange() const final
    {
        for (const auto& pubkey : m_pubkey_args) {
            if (pubkey->IsRange()) return true;
        }
        for (const auto& arg : m_subdescriptor_args) {
            if (arg->IsRange()) return true;
        }
        return false;
    }